

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DynamicTypeHandler::FindNextProperty
          (DynamicTypeHandler *this,ScriptContext *scriptContext,BigPropertyIndex *index,
          JavascriptString **propertyString,PropertyId *propertyId,PropertyAttributes *attributes,
          Type *type,DynamicType *typeToEnumerate,EnumeratorFlags flags,DynamicObject *instance,
          PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ushort local_52;
  BOOL found;
  PropertyIndex smallIndex;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  JavascriptString **propertyString_local;
  BigPropertyIndex *index_local;
  ScriptContext *scriptContext_local;
  DynamicTypeHandler *this_local;
  
  _found = attributes;
  attributes_local = (PropertyAttributes *)propertyId;
  propertyId_local = (PropertyId *)propertyString;
  propertyString_local = (JavascriptString **)index;
  index_local = (BigPropertyIndex *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  iVar3 = GetSlotCapacity(this);
  if (0xfffe < iVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x101,
                                "(GetSlotCapacity() <= PropertyIndexRanges<PropertyIndex>::MaxValue)"
                                ,"GetSlotCapacity() <= PropertyIndexRanges<PropertyIndex>::MaxValue"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_52 = (ushort)*(uint *)propertyString_local;
  if ((*(uint *)propertyString_local & 0xffff) != *(uint *)propertyString_local) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x103,"(static_cast<BigPropertyIndex>(smallIndex) == index)",
                                "static_cast<BigPropertyIndex>(smallIndex) == index");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar3 = (*this->_vptr_DynamicTypeHandler[10])
                    (this,index_local,&local_52,propertyId_local,attributes_local,_found,type,
                     typeToEnumerate,(uint)flags,instance,info);
  *(uint *)propertyString_local = (uint)local_52;
  return iVar3;
}

Assistant:

BOOL
    DynamicTypeHandler::FindNextProperty(ScriptContext* scriptContext, BigPropertyIndex& index, JavascriptString** propertyString,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        // Type handlers that support big property indexes override this function, so if we're here then this type handler does
        // not support big property indexes. Forward the call to the small property index version.
        Assert(GetSlotCapacity() <= PropertyIndexRanges<PropertyIndex>::MaxValue);
        PropertyIndex smallIndex = static_cast<PropertyIndex>(index);
        Assert(static_cast<BigPropertyIndex>(smallIndex) == index);
        const BOOL found = FindNextProperty(scriptContext, smallIndex, propertyString, propertyId, attributes, type, typeToEnumerate, flags, instance, info);
        index = smallIndex;
        return found;
    }